

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O0

int Aig_ManRemapRepr(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pNode2;
  ulong uVar2;
  int local_28;
  int local_24;
  int nFanouts;
  int i;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_28 = 0;
  local_24 = 0;
  do {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= local_24) {
      return local_28;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if (((pObj_00 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0)) &&
       (pNode2 = Aig_ObjFindReprTransitive(p,pObj_00), pNode2 != (Aig_Obj_t *)0x0)) {
      if (pObj_00->Id <= pNode2->Id) {
        __assert_fail("pRepr->Id < pObj->Id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRepr.c"
                      ,0x168,"int Aig_ManRemapRepr(Aig_Man_t *)");
      }
      Aig_ObjSetRepr_(p,pObj_00,pNode2);
      uVar2 = *(ulong *)&pObj_00->field_0x18 >> 6;
      local_28 = (uint)((uVar2 & 0x3ffffff) != 0 && -1 < (int)((uint)uVar2 & 0x3ffffff)) + local_28;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

int Aig_ManRemapRepr( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pRepr;
    int i, nFanouts = 0;
    Aig_ManForEachNode( p, pObj, i )
    {
        pRepr = Aig_ObjFindReprTransitive( p, pObj );
        if ( pRepr == NULL )
            continue;
        assert( pRepr->Id < pObj->Id );
        Aig_ObjSetRepr_( p, pObj, pRepr );
        nFanouts += (pObj->nRefs > 0);
    }
    return nFanouts;
}